

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalStringNoCaseComparer.cpp
# Opt level: O0

int JsUtil::NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::Compare
              (CharacterBuffer<char16_t> *s1,CharacterBuffer<char16_t> *s2)

{
  charcount_t cVar1;
  charcount_t cVar2;
  int iVar3;
  int iVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  int local_3c;
  int i;
  char16 *buf2;
  char16 *buf1;
  int count;
  CharacterBuffer<char16_t> *s2_local;
  CharacterBuffer<char16_t> *s1_local;
  
  cVar1 = CharacterBuffer<char16_t>::GetLength(s1);
  cVar2 = CharacterBuffer<char16_t>::GetLength(s2);
  if (cVar1 == cVar2) {
    cVar1 = CharacterBuffer<char16_t>::GetLength(s1);
    pcVar5 = CharacterBuffer<char16_t>::GetBuffer(s1);
    pcVar6 = CharacterBuffer<char16_t>::GetBuffer(s2);
    for (local_3c = 0; local_3c < (int)cVar1; local_3c = local_3c + 1) {
      iVar3 = tolower((uint)(ushort)pcVar5[local_3c]);
      iVar4 = tolower((uint)(ushort)pcVar6[local_3c]);
      if (iVar3 != iVar4) {
        if ((ushort)pcVar6[local_3c] <= (ushort)pcVar5[local_3c]) {
          return 1;
        }
        return -1;
      }
    }
    s1_local._4_4_ = 0;
  }
  else {
    s1_local._4_4_ = 1;
  }
  return s1_local._4_4_;
}

Assistant:

int NoCaseComparer<JsUtil::CharacterBuffer<WCHAR>>::Compare(JsUtil::CharacterBuffer<WCHAR> const& s1, JsUtil::CharacterBuffer<WCHAR> const& s2)
    {
        if (s1.GetLength() != s2.GetLength()) return +1;
        int count = s1.GetLength();
        const char16* buf1 = s1.GetBuffer();
        const char16* buf2 = s2.GetBuffer();
        for (int i=0; i < count; i++)
        {
            if (tolower(buf1[i]) != tolower(buf2[i]))
            {
                return (buf1[i] < buf2[i] ? -1 : +1);
            }
        }
        return (0);
    }